

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_div_mpi(mbedtls_mpi *Q,mbedtls_mpi *R,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi_uint *pmVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  mbedtls_mpi_uint mVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  mbedtls_mpi_uint p_1 [1];
  mbedtls_mpi Z;
  mbedtls_mpi Y;
  mbedtls_mpi X;
  mbedtls_mpi Y_1;
  mbedtls_mpi T1;
  mbedtls_mpi_uint TP2 [3];
  mbedtls_mpi T2;
  undefined1 local_110 [24];
  long local_f8;
  undefined8 *puStack_f0;
  ulong local_e8;
  ulong local_e0;
  mbedtls_mpi local_d8;
  mbedtls_mpi local_c0;
  mbedtls_mpi local_a8;
  mbedtls_mpi local_90;
  ulong local_78;
  ulong local_70;
  mbedtls_mpi_uint local_68;
  mbedtls_mpi_uint local_60;
  mbedtls_mpi_uint local_58;
  mbedtls_mpi local_48;
  
  local_a8.p = (mbedtls_mpi_uint *)&local_c0;
  local_c0.s = 0;
  local_c0._4_4_ = 0;
  local_a8.s = 1;
  local_a8.n = 1;
  iVar2 = mbedtls_mpi_cmp_mpi(B,&local_a8);
  if (iVar2 == 0) {
    return -0xc;
  }
  local_c0.s = 1;
  local_c0.n = 0;
  local_c0.p = (mbedtls_mpi_uint *)0x0;
  local_d8.s = 1;
  local_d8.n = 0;
  local_d8.p = (mbedtls_mpi_uint *)0x0;
  local_110._16_4_ = 1;
  local_f8 = 0;
  puStack_f0 = (undefined8 *)0x0;
  local_90.s = 1;
  local_90.n = 0;
  local_90.p = (mbedtls_mpi_uint *)0x0;
  local_48.s = 1;
  local_48.n = 3;
  local_48.p = &local_68;
  iVar2 = mbedtls_mpi_cmp_abs(A,B);
  if (iVar2 < 0) {
    if (Q != (mbedtls_mpi *)0x0) {
      iVar2 = mbedtls_mpi_grow(Q,1);
      if (iVar2 != 0) goto LAB_0010841a;
      memset(Q->p,0,Q->n << 3);
      *Q->p = 0;
      Q->s = 1;
    }
    if (R == (mbedtls_mpi *)0x0) {
      return 0;
    }
    iVar2 = mbedtls_mpi_copy(R,A);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    iVar2 = mbedtls_mpi_copy(&local_c0,A);
    if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_copy(&local_d8,B), iVar2 == 0)) {
      local_d8.s = 1;
      local_c0.s = 1;
      iVar2 = mbedtls_mpi_grow((mbedtls_mpi *)(local_110 + 0x10),A->n + 2);
      if ((iVar2 == 0) &&
         (iVar2 = mbedtls_mpi_grow((mbedtls_mpi *)(local_110 + 0x10),1), iVar2 == 0)) {
        memset(puStack_f0,0,local_f8 << 3);
        *puStack_f0 = 0;
        local_110._16_4_ = 1;
        iVar2 = mbedtls_mpi_grow(&local_90,2);
        if (iVar2 == 0) {
          sVar4 = mbedtls_mpi_bitlen(&local_d8);
          uVar9 = (ulong)((uint)sVar4 & 0x3f);
          if (uVar9 == 0x3f) {
            uVar9 = 0;
          }
          else {
            uVar9 = uVar9 ^ 0x3f;
            iVar2 = mbedtls_mpi_shift_l(&local_c0,uVar9);
            if ((iVar2 != 0) || (iVar2 = mbedtls_mpi_shift_l(&local_d8,uVar9), iVar2 != 0))
            goto LAB_0010841a;
          }
          sVar4 = local_c0.n;
          local_e0 = local_d8.n;
          local_110._8_8_ = local_c0.n - local_d8.n;
          local_e8 = local_110._8_8_ * 0x40;
          iVar2 = mbedtls_mpi_shift_l(&local_d8,local_e8);
          if (iVar2 == 0) {
            local_78 = local_e0 - 1;
            local_70 = uVar9;
            do {
              iVar2 = mbedtls_mpi_cmp_mpi(&local_c0,&local_d8);
              if (iVar2 < 0) {
                iVar2 = mbedtls_mpi_shift_r(&local_d8,local_e8);
                if (iVar2 == 0) {
                  uVar9 = sVar4 - 1;
                  if (uVar9 <= local_78) goto LAB_00108765;
                  local_e8 = ~local_e0;
                  goto LAB_001084d3;
                }
                break;
              }
              puStack_f0[local_110._8_8_] = puStack_f0[local_110._8_8_] + 1;
              iVar2 = mbedtls_mpi_sub_mpi(&local_c0,&local_c0,&local_d8);
            } while (iVar2 == 0);
          }
        }
      }
    }
  }
  goto LAB_0010841a;
  while( true ) {
    iVar2 = mbedtls_mpi_shift_l(&local_90,lVar7 * 0x40);
    if ((iVar2 != 0) || (iVar2 = mbedtls_mpi_sub_mpi(&local_c0,&local_c0,&local_90), iVar2 != 0))
    goto LAB_0010841a;
    local_110._0_8_ = 0;
    local_a8.s = 1;
    local_a8.n = 1;
    local_a8.p = (mbedtls_mpi_uint *)local_110;
    iVar2 = mbedtls_mpi_cmp_mpi(&local_c0,&local_a8);
    if (iVar2 < 0) {
      iVar2 = mbedtls_mpi_copy(&local_90,&local_d8);
      if (((iVar2 != 0) || (iVar2 = mbedtls_mpi_shift_l(&local_90,lVar7 * 0x40), iVar2 != 0)) ||
         (iVar2 = mbedtls_mpi_add_mpi(&local_c0,&local_c0,&local_90), iVar2 != 0))
      goto LAB_0010841a;
      puStack_f0[lVar7] = puStack_f0[lVar7] + -1;
    }
    uVar9 = local_110._8_8_ - 1;
    sVar4 = local_110._8_8_;
    if (uVar9 <= local_78) break;
LAB_001084d3:
    pmVar1 = local_c0.p;
    uVar5 = 0xffffffffffffffff;
    local_110._8_8_ = uVar9;
    if (local_c0.p[uVar9] < local_d8.p[local_e0 - 1]) {
      auVar10 = __udivti3(local_c0.p[sVar4 - 2],local_c0.p[uVar9],local_d8.p[local_e0 - 1],0);
      uVar5 = -(ulong)(auVar10._8_8_ != 0) | auVar10._0_8_;
    }
    puStack_f0[sVar4 + local_e8] = uVar5;
    if ((ulong)local_110._8_8_ < 2) {
      local_68 = 0;
    }
    else {
      local_68 = pmVar1[sVar4 - 3];
    }
    local_60 = pmVar1[sVar4 - 2];
    local_58 = pmVar1[local_110._8_8_];
    lVar7 = sVar4 + local_e8;
    puStack_f0[lVar7] = puStack_f0[lVar7] + 1;
    do {
      puStack_f0[lVar7] = puStack_f0[lVar7] + -1;
      iVar2 = mbedtls_mpi_lset(&local_90,0);
      if (iVar2 != 0) goto LAB_0010841a;
      if (local_78 == 0) {
        mVar6 = 0;
      }
      else {
        mVar6 = local_d8.p[local_e0 - 2];
      }
      *local_90.p = mVar6;
      local_90.p[1] = local_d8.p[local_e0 - 1];
      local_110._0_8_ = puStack_f0[lVar7];
      local_a8.s = 1;
      local_a8.n = 1;
      local_a8.p = (mbedtls_mpi_uint *)local_110;
      iVar2 = mbedtls_mpi_mul_mpi(&local_90,&local_90,&local_a8);
      if (iVar2 != 0) goto LAB_0010841a;
      iVar2 = mbedtls_mpi_cmp_mpi(&local_90,&local_48);
    } while (0 < iVar2);
    local_110._0_8_ = puStack_f0[lVar7];
    local_a8.s = 1;
    local_a8.n = 1;
    local_a8.p = (mbedtls_mpi_uint *)local_110;
    iVar2 = mbedtls_mpi_mul_mpi(&local_90,&local_d8,&local_a8);
    if (iVar2 != 0) goto LAB_0010841a;
  }
LAB_00108765:
  if (Q != (mbedtls_mpi *)0x0) {
    iVar2 = mbedtls_mpi_copy(Q,(mbedtls_mpi *)(local_110 + 0x10));
    if (iVar2 != 0) goto LAB_0010841a;
    Q->s = B->s * A->s;
  }
  iVar8 = 0;
  iVar2 = iVar8;
  if ((R != (mbedtls_mpi *)0x0) && (iVar2 = mbedtls_mpi_shift_r(&local_c0,local_70), iVar2 == 0)) {
    local_c0.s = A->s;
    iVar2 = mbedtls_mpi_copy(R,&local_c0);
    if (iVar2 == 0) {
      local_a8.p = (mbedtls_mpi_uint *)local_110;
      local_110._0_8_ = 0;
      local_a8.s = 1;
      local_a8.n = 1;
      iVar3 = mbedtls_mpi_cmp_mpi(R,&local_a8);
      iVar2 = iVar8;
      if (iVar3 == 0) {
        R->s = 1;
      }
    }
  }
LAB_0010841a:
  mbedtls_mpi_free(&local_c0);
  mbedtls_mpi_free(&local_d8);
  mbedtls_mpi_free((mbedtls_mpi *)(local_110 + 0x10));
  mbedtls_mpi_free(&local_90);
  mbedtls_platform_zeroize(&local_68,0x18);
  return iVar2;
}

Assistant:

int mbedtls_mpi_div_mpi( mbedtls_mpi *Q, mbedtls_mpi *R, const mbedtls_mpi *A,
                         const mbedtls_mpi *B )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, n, t, k;
    mbedtls_mpi X, Y, Z, T1, T2;
    mbedtls_mpi_uint TP2[3];
    MPI_VALIDATE_RET( A != NULL );
    MPI_VALIDATE_RET( B != NULL );

    if( mbedtls_mpi_cmp_int( B, 0 ) == 0 )
        return( MBEDTLS_ERR_MPI_DIVISION_BY_ZERO );

    mbedtls_mpi_init( &X ); mbedtls_mpi_init( &Y ); mbedtls_mpi_init( &Z );
    mbedtls_mpi_init( &T1 );
    /*
     * Avoid dynamic memory allocations for constant-size T2.
     *
     * T2 is used for comparison only and the 3 limbs are assigned explicitly,
     * so nobody increase the size of the MPI and we're safe to use an on-stack
     * buffer.
     */
    T2.s = 1;
    T2.n = sizeof( TP2 ) / sizeof( *TP2 );
    T2.p = TP2;

    if( mbedtls_mpi_cmp_abs( A, B ) < 0 )
    {
        if( Q != NULL ) MBEDTLS_MPI_CHK( mbedtls_mpi_lset( Q, 0 ) );
        if( R != NULL ) MBEDTLS_MPI_CHK( mbedtls_mpi_copy( R, A ) );
        return( 0 );
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &X, A ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Y, B ) );
    X.s = Y.s = 1;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &Z, A->n + 2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &Z,  0 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &T1, 2 ) );

    k = mbedtls_mpi_bitlen( &Y ) % biL;
    if( k < biL - 1 )
    {
        k = biL - 1 - k;
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &X, k ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &Y, k ) );
    }
    else k = 0;

    n = X.n - 1;
    t = Y.n - 1;
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &Y, biL * ( n - t ) ) );

    while( mbedtls_mpi_cmp_mpi( &X, &Y ) >= 0 )
    {
        Z.p[n - t]++;
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X, &X, &Y ) );
    }
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Y, biL * ( n - t ) ) );

    for( i = n; i > t ; i-- )
    {
        if( X.p[i] >= Y.p[t] )
            Z.p[i - t - 1] = ~0;
        else
        {
            Z.p[i - t - 1] = mbedtls_int_div_int( X.p[i], X.p[i - 1],
                                                            Y.p[t], NULL);
        }

        T2.p[0] = ( i < 2 ) ? 0 : X.p[i - 2];
        T2.p[1] = ( i < 1 ) ? 0 : X.p[i - 1];
        T2.p[2] = X.p[i];

        Z.p[i - t - 1]++;
        do
        {
            Z.p[i - t - 1]--;

            MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &T1, 0 ) );
            T1.p[0] = ( t < 1 ) ? 0 : Y.p[t - 1];
            T1.p[1] = Y.p[t];
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T1, &T1, Z.p[i - t - 1] ) );
        }
        while( mbedtls_mpi_cmp_mpi( &T1, &T2 ) > 0 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T1, &Y, Z.p[i - t - 1] ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &T1,  biL * ( i - t - 1 ) ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X, &X, &T1 ) );

        if( mbedtls_mpi_cmp_int( &X, 0 ) < 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &T1, &Y ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &T1, biL * ( i - t - 1 ) ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &X, &X, &T1 ) );
            Z.p[i - t - 1]--;
        }
    }

    if( Q != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( Q, &Z ) );
        Q->s = A->s * B->s;
    }

    if( R != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &X, k ) );
        X.s = A->s;
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( R, &X ) );

        if( mbedtls_mpi_cmp_int( R, 0 ) == 0 )
            R->s = 1;
    }

cleanup:

    mbedtls_mpi_free( &X ); mbedtls_mpi_free( &Y ); mbedtls_mpi_free( &Z );
    mbedtls_mpi_free( &T1 );
    mbedtls_platform_zeroize( TP2, sizeof( TP2 ) );

    return( ret );
}